

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_USADA8(DisasContext_conflict1 *s,arg_USADA8 *a)

{
  ulong uVar1;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_1;
  TCGv_i32 ret;
  TCGv_i32 pTVar2;
  uintptr_t o_2;
  uintptr_t o;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  uVar1 = s->features;
  if ((uVar1 & 8) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    ret = load_reg(s,a->rn);
    pTVar2 = load_reg(s,a->rm);
    local_48 = (TCGTemp *)(ret + (long)tcg_ctx);
    local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,helper_usad8_aarch64,local_48,2,&local_48);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    if (a->ra != 0xf) {
      pTVar2 = load_reg(s,a->ra);
      tcg_gen_add_i32(tcg_ctx,ret,ret,pTVar2);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    }
    store_reg(s,a->rd,ret);
  }
  return SUB41(((uint)uVar1 & 8) >> 3,0);
}

Assistant:

static bool trans_USADA8(DisasContext *s, arg_USADA8 *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    gen_helper_usad8(tcg_ctx, t1, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t2);
    if (a->ra != 15) {
        t2 = load_reg(s, a->ra);
        tcg_gen_add_i32(tcg_ctx, t1, t1, t2);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
    store_reg(s, a->rd, t1);
    return true;
}